

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol
          (Tables *this,string_view full_name,Symbol symbol)

{
  SymbolsByNameSet *common;
  ctrl_t *pcVar1;
  ushort uVar2;
  ushort x;
  bool bVar3;
  uint32_t uVar4;
  uint uVar5;
  Nullable<const_char_*> failure_msg;
  CommonFields *common_00;
  ctrl_t *pcVar6;
  slot_type *psVar7;
  EqualElement<google::protobuf::Symbol> *f;
  size_t sVar8;
  reference key;
  Symbol *ts;
  Symbol *ts_00;
  SymbolByFullNameHash *s;
  Symbol *s_00;
  PolicyFunctions *in_R9;
  ushort x_00;
  ulong uVar9;
  undefined4 uVar10;
  undefined1 auVar11 [16];
  __m128i match;
  ctrl_t cVar12;
  ctrl_t cVar14;
  ctrl_t cVar15;
  ctrl_t cVar16;
  ctrl_t cVar17;
  ctrl_t cVar18;
  ctrl_t cVar19;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  ctrl_t cVar23;
  ctrl_t cVar24;
  ctrl_t cVar25;
  ctrl_t cVar26;
  ctrl_t cVar27;
  ctrl_t cVar28;
  undefined1 auVar13 [16];
  FindInfo target;
  probe_seq<16UL> seq;
  Symbol symbol_local;
  iterator local_88;
  ctrl_t local_78;
  ctrl_t cStack_77;
  ctrl_t cStack_76;
  ctrl_t cStack_75;
  ctrl_t cStack_74;
  ctrl_t cStack_73;
  ctrl_t cStack_72;
  ctrl_t cStack_71;
  ctrl_t cStack_70;
  ctrl_t cStack_6f;
  ctrl_t cStack_6e;
  ctrl_t cStack_6d;
  ctrl_t cStack_6c;
  ctrl_t cStack_6b;
  ctrl_t cStack_6a;
  ctrl_t cStack_69;
  undefined1 local_68 [16];
  string_view full_name_local;
  iterator local_40;
  
  full_name_local._M_str = full_name._M_str;
  full_name_local._M_len = full_name._M_len;
  symbol_local = symbol;
  seq._0_16_ = Symbol::full_name(&symbol_local);
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          (&full_name_local,(basic_string_view<char,_std::char_traits<char>_> *)&seq
                           ,"full_name == symbol.full_name()");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&seq,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x88d,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&seq);
  }
  common = &this->symbols_by_name_;
  s = (SymbolByFullNameHash *)&symbol_local;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  ::AssertOnFind<google::protobuf::Symbol>
            (&common->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ,&symbol_local);
  bVar3 = absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::is_soo(&common->
                    super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                  );
  if (bVar3) {
    bVar3 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::empty(&common->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                   );
    if (bVar3) {
      bVar3 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::is_soo(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
      if (!bVar3) {
        __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe3f,
                      "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>]"
                     );
      }
      absl::lts_20250127::container_internal::CommonFields::set_full_soo((CommonFields *)common);
      local_40 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::soo_iterator(&common->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               );
    }
    else {
      seq.offset_ = (size_t)common;
      seq.mask_ = (size_t)&symbol_local;
      f = (EqualElement<google::protobuf::Symbol> *)
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ::soo_slot(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
      bVar3 = absl::lts_20250127::container_internal::
              hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
              ::
              apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                        ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                          *)&seq,f,ts_00);
      if (bVar3) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::soo_iterator(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
        return false;
      }
      s_00 = (Symbol *)0x3;
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
      ::resize_impl(common);
      sVar8 = protobuf::(anonymous_namespace)::SymbolByFullNameHash::operator()
                        ((SymbolByFullNameHash *)&symbol_local,s_00);
      sVar8 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                        (sVar8,8,(CommonFields *)common);
      local_40 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::iterator_at(&common->
                                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                               ,sVar8);
    }
  }
  else {
    bVar3 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::is_soo(&common->
                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                    );
    if (bVar3) {
      __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf66,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                   );
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
    ::prefetch_heap_block
              (&common->
                super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              );
    common_00 = (CommonFields *)
                protobuf::(anonymous_namespace)::SymbolByFullNameHash::operator()
                          ((SymbolByFullNameHash *)&symbol_local,(Symbol *)s);
    absl::lts_20250127::container_internal::probe(&seq,(CommonFields *)common,(size_t)common_00);
    pcVar6 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::control(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
    auVar11 = ZEXT216(CONCAT11((char)common_00,(char)common_00) & 0x7f7f);
    auVar11 = pshuflw(auVar11,auVar11,0);
    uVar10 = auVar11._0_4_;
    local_68._4_4_ = uVar10;
    local_68._0_4_ = uVar10;
    local_68._8_4_ = uVar10;
    local_68._12_4_ = uVar10;
    while( true ) {
      pcVar1 = pcVar6 + seq.offset_;
      auVar11[0] = -(local_68[0] == *pcVar1);
      auVar11[1] = -(local_68[1] == pcVar1[1]);
      auVar11[2] = -(local_68[2] == pcVar1[2]);
      auVar11[3] = -(local_68[3] == pcVar1[3]);
      auVar11[4] = -(local_68[4] == pcVar1[4]);
      auVar11[5] = -(local_68[5] == pcVar1[5]);
      auVar11[6] = -(local_68[6] == pcVar1[6]);
      auVar11[7] = -(local_68[7] == pcVar1[7]);
      auVar11[8] = -(local_68[8] == pcVar1[8]);
      auVar11[9] = -(local_68[9] == pcVar1[9]);
      auVar11[10] = -(local_68[10] == pcVar1[10]);
      auVar11[0xb] = -(local_68[0xb] == pcVar1[0xb]);
      auVar11[0xc] = -(local_68[0xc] == pcVar1[0xc]);
      auVar11[0xd] = -(local_68[0xd] == pcVar1[0xd]);
      auVar11[0xe] = -(local_68[0xe] == pcVar1[0xe]);
      auVar11[0xf] = -(local_68[0xf] == pcVar1[0xf]);
      cVar12 = *pcVar1;
      cVar14 = pcVar1[1];
      cVar15 = pcVar1[2];
      cVar16 = pcVar1[3];
      cVar17 = pcVar1[4];
      cVar18 = pcVar1[5];
      cVar19 = pcVar1[6];
      cVar20 = pcVar1[7];
      cVar21 = pcVar1[8];
      cVar22 = pcVar1[9];
      cVar23 = pcVar1[10];
      cVar24 = pcVar1[0xb];
      cVar25 = pcVar1[0xc];
      cVar26 = pcVar1[0xd];
      cVar27 = pcVar1[0xe];
      cVar28 = pcVar1[0xf];
      for (x_00 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar11[0xf] >> 7) << 0xf; x_00 != 0; x_00 = x_00 - 1 & x_00) {
        local_78 = cVar12;
        cStack_77 = cVar14;
        cStack_76 = cVar15;
        cStack_75 = cVar16;
        cStack_74 = cVar17;
        cStack_73 = cVar18;
        cStack_72 = cVar19;
        cStack_71 = cVar20;
        cStack_70 = cVar21;
        cStack_6f = cVar22;
        cStack_6e = cVar23;
        cStack_6d = cVar24;
        cStack_6c = cVar25;
        cStack_6b = cVar26;
        cStack_6a = cVar27;
        cStack_69 = cVar28;
        uVar4 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x_00);
        local_88.field_1.slot_ = (slot_type *)common;
        local_88.ctrl_ = (ctrl_t *)&symbol_local;
        psVar7 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                 ::slot_array(&common->
                               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                             );
        bVar3 = absl::lts_20250127::container_internal::
                hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                ::
                apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>::EqualElement<google::protobuf::Symbol>,google::protobuf::Symbol&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>>
                          ((hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,void>
                            *)&local_88,
                           (EqualElement<google::protobuf::Symbol> *)
                           (psVar7 + (seq.offset_ + uVar4 & seq.mask_)),ts);
        if (bVar3) {
          sVar8 = uVar4 + seq.offset_ & seq.mask_;
          goto LAB_002c9f3d;
        }
        cVar12 = local_78;
        cVar14 = cStack_77;
        cVar15 = cStack_76;
        cVar16 = cStack_75;
        cVar17 = cStack_74;
        cVar18 = cStack_73;
        cVar19 = cStack_72;
        cVar20 = cStack_71;
        cVar21 = cStack_70;
        cVar22 = cStack_6f;
        cVar23 = cStack_6e;
        cVar24 = cStack_6d;
        cVar25 = cStack_6c;
        cVar26 = cStack_6b;
        cVar27 = cStack_6a;
        cVar28 = cStack_69;
      }
      auVar13[0] = -(cVar12 == kEmpty);
      auVar13[1] = -(cVar14 == kEmpty);
      auVar13[2] = -(cVar15 == kEmpty);
      auVar13[3] = -(cVar16 == kEmpty);
      auVar13[4] = -(cVar17 == kEmpty);
      auVar13[5] = -(cVar18 == kEmpty);
      auVar13[6] = -(cVar19 == kEmpty);
      auVar13[7] = -(cVar20 == kEmpty);
      auVar13[8] = -(cVar21 == kEmpty);
      auVar13[9] = -(cVar22 == kEmpty);
      auVar13[10] = -(cVar23 == kEmpty);
      auVar13[0xb] = -(cVar24 == kEmpty);
      auVar13[0xc] = -(cVar25 == kEmpty);
      auVar13[0xd] = -(cVar26 == kEmpty);
      auVar13[0xe] = -(cVar27 == kEmpty);
      auVar13[0xf] = -(cVar28 == kEmpty);
      x = (ushort)(SUB161(auVar13 >> 7,0) & 1) | (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
          (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
          (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
          (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
          (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
          (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
          (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe | (ushort)(auVar13[0xf] >> 7) << 0xf;
      if (x != 0) break;
      uVar9 = seq.index_ + 0x10;
      seq.offset_ = seq.offset_ + uVar9 & seq.mask_;
      seq.index_ = uVar9;
      sVar8 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
              ::capacity(&common->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        );
      if (sVar8 < uVar9) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xf7d,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, K = google::protobuf::Symbol]"
                     );
      }
    }
    sVar8 = absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
            ::capacity(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
    pcVar6 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::control(&common->
                        super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                      );
    bVar3 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                      (sVar8,(size_t)common_00,pcVar6);
    if (bVar3) {
      uVar2 = 0xf;
      if (x != 0) {
        for (; x >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar5 = (ushort)((uVar2 ^ 0xfff0) + 0x11) - 1;
    }
    else {
      uVar5 = absl::lts_20250127::container_internal::TrailingZeros<unsigned_short>(x);
    }
    target.probe_length =
         (size_t)absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,std::allocator<google::protobuf::Symbol>>
                 ::GetPolicyFunctions()::value;
    target.offset = seq.index_;
    sVar8 = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                      ((container_internal *)common,common_00,uVar5 + seq.offset_ & seq.mask_,target
                       ,in_R9);
LAB_002c9f3d:
    local_40 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
               ::iterator_at(&common->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                             ,sVar8);
    if (x_00 != 0) {
      return false;
    }
  }
  sVar8 = (common->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  (common->
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
  ).settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9c;
  (local_40.field_1.slot_)->ptr_ = symbol_local.ptr_;
  seq._0_16_ = local_40;
  absl::lts_20250127::container_internal::CommonFields::set_capacity((CommonFields *)common,sVar8);
  key = absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
        ::iterator::operator*((iterator *)&seq);
  local_88 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
             ::find<google::protobuf::Symbol>
                       (&common->
                         super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_std::allocator<google::protobuf::Symbol>_>
                        ,key);
  bVar3 = absl::lts_20250127::container_internal::operator==(&local_88,&local_40);
  if (!bVar3) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xfe2,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, google::protobuf::(anonymous namespace)::SymbolByFullNameHash, google::protobuf::(anonymous namespace)::SymbolByFullNameEq, std::allocator<google::protobuf::Symbol>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<google::protobuf::Symbol>, Hash = google::protobuf::(anonymous namespace)::SymbolByFullNameHash, Eq = google::protobuf::(anonymous namespace)::SymbolByFullNameEq, Alloc = std::allocator<google::protobuf::Symbol>, Args = <const google::protobuf::Symbol &>]"
                 );
  }
  std::vector<google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>_>::push_back
            (&this->symbols_after_checkpoint_,&symbol_local);
  return true;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(absl::string_view full_name,
                                       Symbol symbol) {
  ABSL_DCHECK_EQ(full_name, symbol.full_name());
  if (symbols_by_name_.insert(symbol).second) {
    symbols_after_checkpoint_.push_back(symbol);
    return true;
  } else {
    return false;
  }
}